

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qdatetimeedit.cpp
# Opt level: O0

void QDateTimeEdit::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  QDate QVar1;
  bool bVar2;
  QDateTime QVar3;
  TimeSpec TVar4;
  time_t tVar5;
  QtMocHelpers *in_RCX;
  QDateTimeEdit *this;
  uint in_EDX;
  int iVar6;
  code *in_RSI;
  QDateTimeEdit *in_RDI;
  long in_FS_OFFSET;
  void *_v_1;
  void *_v;
  QDateTimeEdit *_t;
  undefined4 in_stack_fffffffffffffeb8;
  QFlagsStorage<QDateTimeEdit::Section> in_stack_fffffffffffffebc;
  QDateTime *in_stack_fffffffffffffec0;
  QDateTime *in_stack_fffffffffffffec8;
  QDateTime *in_stack_fffffffffffffed0;
  QDateTimeEdit *in_stack_fffffffffffffed8;
  QDateTimeEdit *in_stack_fffffffffffffee0;
  undefined8 in_stack_fffffffffffffee8;
  QTime min;
  QDate in_stack_fffffffffffffef8;
  QDateTime *pQVar7;
  QDate in_stack_ffffffffffffff08;
  code *in_stack_ffffffffffffff10;
  QDateTimeEdit *in_stack_ffffffffffffff18;
  QTimeZone local_88 [4];
  int local_68;
  int local_64;
  qint64 local_60;
  qint64 local_58;
  QDateTime local_50 [8];
  QDateTime local_48 [12];
  TimeSpec local_3c;
  qint64 local_38;
  QDateTime local_30 [12];
  uint local_24;
  code *local_20;
  code *local_18;
  uint local_c;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  iVar6 = (int)in_RSI;
  if (iVar6 == 0) {
    in_stack_fffffffffffffee0 = (QDateTimeEdit *)(ulong)in_EDX;
    switch(in_stack_fffffffffffffee0) {
    case (QDateTimeEdit *)0x0:
      in_RSI = *(code **)(in_RCX + 8);
      dateTimeChanged((QDateTimeEdit *)in_stack_fffffffffffffec0,
                      (QDateTime *)CONCAT44(in_stack_fffffffffffffebc.i,in_stack_fffffffffffffeb8));
      break;
    case (QDateTimeEdit *)0x1:
      local_c = **(uint **)(in_RCX + 8);
      in_RSI = (code *)(ulong)local_c;
      timeChanged((QDateTimeEdit *)0x562b32,(QTime)in_stack_fffffffffffffebc.i);
      break;
    case (QDateTimeEdit *)0x2:
      in_RSI = (code *)**(undefined8 **)(in_RCX + 8);
      QVar1.jd._4_4_ = in_stack_fffffffffffffebc.i;
      QVar1.jd._0_4_ = in_stack_fffffffffffffeb8;
      local_18 = in_RSI;
      dateChanged((QDateTimeEdit *)0x562b60,QVar1);
      break;
    case (QDateTimeEdit *)0x3:
      in_RSI = *(code **)(in_RCX + 8);
      setDateTime((QDateTimeEdit *)in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
      break;
    case (QDateTimeEdit *)0x4:
      in_RSI = (code *)**(undefined8 **)(in_RCX + 8);
      local_20 = in_RSI;
      setDate(in_stack_fffffffffffffed8,in_stack_ffffffffffffff08);
      break;
    case (QDateTimeEdit *)0x5:
      local_24 = **(uint **)(in_RCX + 8);
      in_RSI = (code *)(ulong)local_24;
      setTime((QDateTimeEdit *)in_stack_fffffffffffffed0,
              (QTime)(int)((ulong)in_stack_fffffffffffffee8 >> 0x20));
      break;
    case (QDateTimeEdit *)0x6:
      d_func((QDateTimeEdit *)0x562bda);
      QDateTimeEditPrivate::_q_resetButton((QDateTimeEditPrivate *)0x562be2);
    }
  }
  if (iVar6 == 5) {
    bVar2 = QtMocHelpers::indexOfMethod<void(QDateTimeEdit::*)(QDateTime_const&)>
                      (in_RCX,(void **)dateTimeChanged,0,0);
    if (bVar2) goto switchD_0056318b_default;
    in_stack_ffffffffffffff10 = timeChanged;
    in_stack_ffffffffffffff18 = (QDateTimeEdit *)0x0;
    bVar2 = QtMocHelpers::indexOfMethod<void(QDateTimeEdit::*)(QTime)>
                      (in_RCX,(void **)timeChanged,0,1);
    if (bVar2) goto switchD_0056318b_default;
    in_stack_ffffffffffffff08.jd = 0;
    in_RSI = dateChanged;
    bVar2 = QtMocHelpers::indexOfMethod<void(QDateTimeEdit::*)(QDate)>
                      (in_RCX,(void **)dateChanged,0,2);
    if (bVar2) goto switchD_0056318b_default;
  }
  if (iVar6 == 1) {
    in_stack_fffffffffffffef8.jd = *(qint64 *)in_RCX;
    in_stack_fffffffffffffed8 = (QDateTimeEdit *)(ulong)in_EDX;
    switch(in_stack_fffffffffffffed8) {
    case (QDateTimeEdit *)0x0:
      dateTime((QDateTimeEdit *)in_stack_fffffffffffffec8);
      QDateTime::operator=
                (in_stack_fffffffffffffec0,
                 (QDateTime *)CONCAT44(in_stack_fffffffffffffebc.i,in_stack_fffffffffffffeb8));
      QDateTime::~QDateTime(local_30);
      break;
    case (QDateTimeEdit *)0x1:
      local_38 = (qint64)date((QDateTimeEdit *)
                              CONCAT44(in_stack_fffffffffffffebc.i,in_stack_fffffffffffffeb8));
      *(qint64 *)in_stack_fffffffffffffef8.jd = local_38;
      break;
    case (QDateTimeEdit *)0x2:
      tVar5 = time(in_RDI,(time_t *)in_RSI);
      local_3c = (TimeSpec)tVar5;
      *(TimeSpec *)in_stack_fffffffffffffef8.jd = local_3c;
      break;
    case (QDateTimeEdit *)0x3:
      maximumDateTime((QDateTimeEdit *)in_stack_fffffffffffffec8);
      QDateTime::operator=
                (in_stack_fffffffffffffec0,
                 (QDateTime *)CONCAT44(in_stack_fffffffffffffebc.i,in_stack_fffffffffffffeb8));
      QDateTime::~QDateTime(local_48);
      break;
    case (QDateTimeEdit *)0x4:
      minimumDateTime((QDateTimeEdit *)in_stack_fffffffffffffec8);
      QDateTime::operator=
                (in_stack_fffffffffffffec0,
                 (QDateTime *)CONCAT44(in_stack_fffffffffffffebc.i,in_stack_fffffffffffffeb8));
      QDateTime::~QDateTime(local_50);
      break;
    case (QDateTimeEdit *)0x5:
      local_58 = (qint64)maximumDate((QDateTimeEdit *)
                                     CONCAT44(in_stack_fffffffffffffebc.i,in_stack_fffffffffffffeb8)
                                    );
      *(qint64 *)in_stack_fffffffffffffef8.jd = local_58;
      break;
    case (QDateTimeEdit *)0x6:
      local_60 = (qint64)minimumDate((QDateTimeEdit *)
                                     CONCAT44(in_stack_fffffffffffffebc.i,in_stack_fffffffffffffeb8)
                                    );
      *(qint64 *)in_stack_fffffffffffffef8.jd = local_60;
      break;
    case (QDateTimeEdit *)0x7:
      local_64 = (int)maximumTime((QDateTimeEdit *)
                                  CONCAT44(in_stack_fffffffffffffebc.i,in_stack_fffffffffffffeb8));
      *(int *)in_stack_fffffffffffffef8.jd = local_64;
      break;
    case (QDateTimeEdit *)0x8:
      local_68 = (int)minimumTime((QDateTimeEdit *)
                                  CONCAT44(in_stack_fffffffffffffebc.i,in_stack_fffffffffffffeb8));
      *(int *)in_stack_fffffffffffffef8.jd = local_68;
      break;
    case (QDateTimeEdit *)0x9:
      TVar4 = currentSection((QDateTimeEdit *)in_stack_fffffffffffffec0);
      *(TimeSpec *)in_stack_fffffffffffffef8.jd = TVar4;
      break;
    case (QDateTimeEdit *)0xa:
      pQVar7 = (QDateTime *)in_stack_fffffffffffffef8.jd;
      displayedSections((QDateTimeEdit *)in_stack_fffffffffffffec0);
      QtMocHelpers::assignFlags<QFlags<QDateTimeEdit::Section>>
                ((void *)0x562eb4,(QFlags<QDateTimeEdit::Section>)in_stack_fffffffffffffebc.i);
      in_stack_fffffffffffffed0 = (QDateTime *)in_stack_fffffffffffffef8.jd;
      in_stack_fffffffffffffef8.jd = (qint64)pQVar7;
      break;
    case (QDateTimeEdit *)0xb:
      displayFormat(in_stack_fffffffffffffed8);
      QString::operator=((QString *)in_stack_fffffffffffffec0,
                         (QString *)CONCAT44(in_stack_fffffffffffffebc.i,in_stack_fffffffffffffeb8))
      ;
      QString::~QString((QString *)0x562eea);
      break;
    case (QDateTimeEdit *)0xc:
      QVar3 = (QDateTime)calendarPopup((QDateTimeEdit *)in_stack_fffffffffffffec0);
      *(QDateTime *)in_stack_fffffffffffffef8.jd = QVar3;
      break;
    case (QDateTimeEdit *)0xd:
      TVar4 = currentSectionIndex((QDateTimeEdit *)in_stack_fffffffffffffec0);
      *(TimeSpec *)in_stack_fffffffffffffef8.jd = TVar4;
      break;
    case (QDateTimeEdit *)0xe:
      TVar4 = sectionCount((QDateTimeEdit *)in_stack_fffffffffffffec0);
      *(TimeSpec *)in_stack_fffffffffffffef8.jd = TVar4;
      break;
    case (QDateTimeEdit *)0xf:
      TVar4 = timeSpec((QDateTimeEdit *)in_stack_fffffffffffffec0);
      *(TimeSpec *)in_stack_fffffffffffffef8.jd = TVar4;
      break;
    case (QDateTimeEdit *)0x10:
      timeZone((QDateTimeEdit *)in_stack_fffffffffffffec8);
      QTimeZone::operator=
                ((QTimeZone *)in_stack_fffffffffffffec0,
                 (QTimeZone *)CONCAT44(in_stack_fffffffffffffebc.i,in_stack_fffffffffffffeb8));
      QTimeZone::~QTimeZone(local_88);
    }
  }
  if (iVar6 == 2) {
    QVar1.jd = *(qint64 *)in_RCX;
    in_stack_fffffffffffffec8 = (QDateTime *)(ulong)in_EDX;
    min.mds = (int)((ulong)QVar1.jd >> 0x20);
    switch(in_stack_fffffffffffffec8) {
    case (QDateTime *)0x0:
      setDateTime((QDateTimeEdit *)in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
      break;
    case (QDateTime *)0x1:
      setDate(in_stack_fffffffffffffed8,in_stack_ffffffffffffff08);
      break;
    case (QDateTime *)0x2:
      setTime((QDateTimeEdit *)in_stack_fffffffffffffed0,min);
      break;
    case (QDateTime *)0x3:
      setMaximumDateTime(in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
      break;
    case (QDateTime *)0x4:
      setMinimumDateTime(in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
      break;
    case (QDateTime *)0x5:
      setMaximumDate((QDateTimeEdit *)in_stack_fffffffffffffed0,QVar1);
      break;
    case (QDateTime *)0x6:
      setMinimumDate(in_stack_fffffffffffffed8,in_stack_fffffffffffffef8);
      break;
    case (QDateTime *)0x7:
      setMaximumTime((QDateTimeEdit *)in_stack_fffffffffffffed0,min);
      break;
    case (QDateTime *)0x8:
      setMinimumTime((QDateTimeEdit *)in_stack_fffffffffffffed0,min);
      break;
    case (QDateTime *)0x9:
      setCurrentSection((QDateTimeEdit *)QVar1.jd,
                        (Section)((ulong)in_stack_fffffffffffffee0 >> 0x20));
      break;
    default:
      break;
    case (QDateTime *)0xb:
      setDisplayFormat(in_stack_ffffffffffffff18,(QString *)in_stack_ffffffffffffff10);
      break;
    case (QDateTime *)0xc:
      setCalendarPopup((QDateTimeEdit *)in_stack_fffffffffffffed0,false);
      break;
    case (QDateTime *)0xd:
      setCurrentSectionIndex((QDateTimeEdit *)in_stack_fffffffffffffed0,0);
      break;
    case (QDateTime *)0xf:
      setTimeSpec(in_stack_fffffffffffffee0,(TimeSpec)((ulong)in_stack_fffffffffffffed8 >> 0x20));
      break;
    case (QDateTime *)0x10:
      setTimeZone((QDateTimeEdit *)in_stack_fffffffffffffec0,
                  (QTimeZone *)CONCAT44(in_stack_fffffffffffffebc.i,in_stack_fffffffffffffeb8));
    }
  }
  if (iVar6 == 3) {
    this = (QDateTimeEdit *)(ulong)(in_EDX - 3);
    switch(this) {
    case (QDateTimeEdit *)0x0:
      clearMaximumDateTime((QDateTimeEdit *)in_stack_fffffffffffffec8);
      break;
    case (QDateTimeEdit *)0x1:
      clearMinimumDateTime((QDateTimeEdit *)in_stack_fffffffffffffec8);
      break;
    case (QDateTimeEdit *)0x2:
      clearMaximumDate(this);
      break;
    case (QDateTimeEdit *)0x3:
      clearMinimumDate(this);
      break;
    case (QDateTimeEdit *)0x4:
      clearMaximumTime(this);
      break;
    case (QDateTimeEdit *)0x5:
      clearMinimumTime(this);
    }
  }
switchD_0056318b_default:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QDateTimeEdit::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QDateTimeEdit *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->dateTimeChanged((*reinterpret_cast< std::add_pointer_t<QDateTime>>(_a[1]))); break;
        case 1: _t->timeChanged((*reinterpret_cast< std::add_pointer_t<QTime>>(_a[1]))); break;
        case 2: _t->dateChanged((*reinterpret_cast< std::add_pointer_t<QDate>>(_a[1]))); break;
        case 3: _t->setDateTime((*reinterpret_cast< std::add_pointer_t<QDateTime>>(_a[1]))); break;
        case 4: _t->setDate((*reinterpret_cast< std::add_pointer_t<QDate>>(_a[1]))); break;
        case 5: _t->setTime((*reinterpret_cast< std::add_pointer_t<QTime>>(_a[1]))); break;
        case 6: _t->d_func()->_q_resetButton(); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QDateTimeEdit::*)(const QDateTime & )>(_a, &QDateTimeEdit::dateTimeChanged, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QDateTimeEdit::*)(QTime )>(_a, &QDateTimeEdit::timeChanged, 1))
            return;
        if (QtMocHelpers::indexOfMethod<void (QDateTimeEdit::*)(QDate )>(_a, &QDateTimeEdit::dateChanged, 2))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<QDateTime*>(_v) = _t->dateTime(); break;
        case 1: *reinterpret_cast<QDate*>(_v) = _t->date(); break;
        case 2: *reinterpret_cast<QTime*>(_v) = _t->time(); break;
        case 3: *reinterpret_cast<QDateTime*>(_v) = _t->maximumDateTime(); break;
        case 4: *reinterpret_cast<QDateTime*>(_v) = _t->minimumDateTime(); break;
        case 5: *reinterpret_cast<QDate*>(_v) = _t->maximumDate(); break;
        case 6: *reinterpret_cast<QDate*>(_v) = _t->minimumDate(); break;
        case 7: *reinterpret_cast<QTime*>(_v) = _t->maximumTime(); break;
        case 8: *reinterpret_cast<QTime*>(_v) = _t->minimumTime(); break;
        case 9: *reinterpret_cast<Section*>(_v) = _t->currentSection(); break;
        case 10: QtMocHelpers::assignFlags<Sections>(_v, _t->displayedSections()); break;
        case 11: *reinterpret_cast<QString*>(_v) = _t->displayFormat(); break;
        case 12: *reinterpret_cast<bool*>(_v) = _t->calendarPopup(); break;
        case 13: *reinterpret_cast<int*>(_v) = _t->currentSectionIndex(); break;
        case 14: *reinterpret_cast<int*>(_v) = _t->sectionCount(); break;
        case 15: *reinterpret_cast<Qt::TimeSpec*>(_v) = _t->timeSpec(); break;
        case 16: *reinterpret_cast<QTimeZone*>(_v) = _t->timeZone(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setDateTime(*reinterpret_cast<QDateTime*>(_v)); break;
        case 1: _t->setDate(*reinterpret_cast<QDate*>(_v)); break;
        case 2: _t->setTime(*reinterpret_cast<QTime*>(_v)); break;
        case 3: _t->setMaximumDateTime(*reinterpret_cast<QDateTime*>(_v)); break;
        case 4: _t->setMinimumDateTime(*reinterpret_cast<QDateTime*>(_v)); break;
        case 5: _t->setMaximumDate(*reinterpret_cast<QDate*>(_v)); break;
        case 6: _t->setMinimumDate(*reinterpret_cast<QDate*>(_v)); break;
        case 7: _t->setMaximumTime(*reinterpret_cast<QTime*>(_v)); break;
        case 8: _t->setMinimumTime(*reinterpret_cast<QTime*>(_v)); break;
        case 9: _t->setCurrentSection(*reinterpret_cast<Section*>(_v)); break;
        case 11: _t->setDisplayFormat(*reinterpret_cast<QString*>(_v)); break;
        case 12: _t->setCalendarPopup(*reinterpret_cast<bool*>(_v)); break;
        case 13: _t->setCurrentSectionIndex(*reinterpret_cast<int*>(_v)); break;
        case 15: _t->setTimeSpec(*reinterpret_cast<Qt::TimeSpec*>(_v)); break;
        case 16: _t->setTimeZone(*reinterpret_cast<QTimeZone*>(_v)); break;
        default: break;
        }
    }
if (_c == QMetaObject::ResetProperty) {
        switch (_id) {
        case 3: _t->clearMaximumDateTime(); break;
        case 4: _t->clearMinimumDateTime(); break;
        case 5: _t->clearMaximumDate(); break;
        case 6: _t->clearMinimumDate(); break;
        case 7: _t->clearMaximumTime(); break;
        case 8: _t->clearMinimumTime(); break;
        default: break;
        }
    }
}